

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Mtbdd __thiscall
sylvan::Mtbdd::Permute
          (Mtbdd *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *from,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *to)

{
  uint32_t key;
  size_type sVar1;
  const_reference pvVar2;
  MTBDD from_00;
  MTBDD in_RCX;
  Bdd local_48;
  Mtbdd local_40;
  int local_34;
  MtbddMap MStack_30;
  int i;
  MtbddMap map;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *to_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *from_local;
  Mtbdd *this_local;
  
  map.mtbdd = in_RCX;
  MtbddMap::MtbddMap(&stack0xffffffffffffffd0);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(to);
  local_34 = (int)sVar1;
  while (local_34 = local_34 + -1, -1 < local_34) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](to,(long)local_34)
    ;
    key = *pvVar2;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)map.mtbdd,
                        (long)local_34);
    Bdd::bddVar(&local_48,*pvVar2);
    Mtbdd(&local_40,&local_48);
    MtbddMap::put(&stack0xffffffffffffffd0,key,&local_40);
    ~Mtbdd(&local_40);
    Bdd::~Bdd(&local_48);
  }
  from_00 = mtbdd_compose_RUN(*(MTBDD *)from,MStack_30.mtbdd);
  Mtbdd(this,from_00);
  MtbddMap::~MtbddMap(&stack0xffffffffffffffd0);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::Permute(const std::vector<uint32_t>& from, const std::vector<uint32_t>& to) const
{
    /* Create a map */
    MtbddMap map;
    for (int i=from.size()-1; i>=0; i--) {
        map.put(from[i], Bdd::bddVar(to[i]));
    }

    return mtbdd_compose(mtbdd, map.mtbdd);
}